

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O2

level_conflict * level_by_name(level_map_conflict *map,char *name)

{
  level_conflict *plVar1;
  long lVar2;
  int iVar3;
  char *__s2;
  long lVar4;
  long lVar5;
  
  lVar5 = -1;
  lVar2 = -0x50;
  do {
    lVar4 = lVar2;
    lVar5 = lVar5 + 1;
    if (map->num_levels <= lVar5) {
      return (level_conflict *)0x0;
    }
    plVar1 = map->levels;
    __s2 = level_name((level_conflict *)((long)&plVar1[1].index + lVar4));
    iVar3 = strcmp(name,__s2);
    lVar2 = lVar4 + 0x50;
  } while (iVar3 != 0);
  return (level_conflict *)((long)&plVar1[1].index + lVar4);
}

Assistant:

struct level *level_by_name(struct level_map *map, const char *name)
{
	int i;
	for (i = 0; i < map->num_levels; i++) {
		struct level *lev = &map->levels[i];
		if (streq(name, level_name(lev))) {
			return lev;
		}
	}
	return NULL;
}